

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_personality.c
# Opt level: O2

void objc_exception_rethrow(_Unwind_Exception *e)

{
  id receiver;
  BOOL BVar1;
  int iVar2;
  long lVar3;
  SEL selector;
  IMP p_Var4;
  id poVar5;
  uintptr_t addr;
  
  lVar3 = __tls_get_addr(&PTR_00129e08);
  iVar2 = *(int *)(lVar3 + 0x48);
  if (iVar2 == 1) {
    if (e->exception_class != cxx_exception_class) {
      __assert_fail("e->exception_class == cxx_exception_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                    ,0x2ec,"void objc_exception_rethrow(struct _Unwind_Exception *)");
    }
    __cxa_rethrow();
    iVar2 = *(int *)(lVar3 + 0x48);
  }
  else if (iVar2 == 2) {
    if (e->exception_class != 0x474e55434f424a43) {
      __assert_fail("e->exception_class == objc_exception_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                    ,0x2db,"void objc_exception_rethrow(struct _Unwind_Exception *)");
    }
    if (e + -1 == *(_Unwind_Exception **)(lVar3 + 0x50)) {
      iVar2 = (int)e[-1].private_2;
      if (0 < iVar2) {
        *(int *)&e[-1].private_2 = -iVar2;
        iVar2 = _Unwind_Resume_or_Rethrow(e);
        free(e + -1);
        if (_objc_unexpected_exception != (_func_void_id *)0x0 && iVar2 == 5) {
          (*_objc_unexpected_exception)((id)e[1].exception_class);
        }
        abort();
      }
      __assert_fail("ex->catch_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                    ,0x2dd,"void objc_exception_rethrow(struct _Unwind_Exception *)");
    }
    __assert_fail("ex == td->caughtExceptions",
                  "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                  ,0x2dc,"void objc_exception_rethrow(struct _Unwind_Exception *)");
  }
  if (iVar2 == 4) {
    selector = sel_registerName("rethrow");
    receiver = *(id *)(lVar3 + 0x50);
    if (receiver != (id)0x0) {
      poVar5 = receiver;
      if (((ulong)receiver & 7) != 0) {
        poVar5 = (id)((long)SmallObjectClasses + (ulong)(uint)((int)((ulong)receiver & 7) << 3));
      }
      BVar1 = class_respondsToSelector(poVar5->isa,selector);
      if (BVar1 != '\0') {
        p_Var4 = objc_msg_lookup(receiver,selector);
        (*p_Var4)(receiver,selector);
      }
    }
  }
  if (*(_Unwind_Exception **)(lVar3 + 0x50) == e) {
    _Unwind_Resume_or_Rethrow(e);
    abort();
  }
  __assert_fail("e == (struct _Unwind_Exception*)td->caughtExceptions",
                "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/eh_personality.c"
                ,0x2fc,"void objc_exception_rethrow(struct _Unwind_Exception *)");
}

Assistant:

OBJC_PUBLIC void objc_exception_rethrow(struct _Unwind_Exception *e)
{
	struct thread_data *td = get_thread_data_fast();
	// If this is an Objective-C exception, then 
	if (td->current_exception_type == OBJC)
	{
		struct objc_exception *ex = objc_exception_from_header(e);
		assert(e->exception_class == objc_exception_class);
		assert(ex == td->caughtExceptions);
		assert(ex->catch_count > 0);
		// Negate the catch count, so that we can detect that this is a
		// rethrown exception in objc_end_catch
		ex->catch_count = -ex->catch_count;
		_Unwind_Reason_Code err = _Unwind_Resume_or_Rethrow(e);
		free(ex);
		if (_URC_END_OF_STACK == err && 0 != _objc_unexpected_exception)
		{
			_objc_unexpected_exception(ex->object);
		}
		abort();
	}
#ifndef NO_OBJCXX
	else if (td->current_exception_type == CXX)
	{
		assert(e->exception_class == cxx_exception_class);
		__cxa_rethrow();
	}
#endif
	if (td->current_exception_type == BOXED_FOREIGN)
	{
		SEL rethrow_sel = sel_registerName("rethrow");
		id object = (id)td->caughtExceptions;
		if ((nil != object) &&
		    (class_respondsToSelector(classForObject(object), rethrow_sel)))
		{
			DEBUG_LOG("Rethrowing boxed exception\n");
			IMP rethrow = objc_msg_lookup(object, rethrow_sel);
			rethrow(object, rethrow_sel);
		}
	}
	assert(e == (struct _Unwind_Exception*)td->caughtExceptions);
	_Unwind_Resume_or_Rethrow(e);
	abort();
}